

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_InitHooks(cJSON_Hooks *hooks)

{
  code *pcVar1;
  code *pcVar2;
  
  if (hooks == (cJSON_Hooks *)0x0) {
    pcVar1 = free;
    pcVar2 = malloc;
  }
  else {
    pcVar2 = hooks->malloc_fn;
    pcVar1 = hooks->free_fn;
    if (pcVar2 == (_func_void_ptr_size_t *)0x0) {
      pcVar2 = malloc;
    }
    if (pcVar1 == (_func_void_void_ptr *)0x0) {
      pcVar1 = free;
    }
  }
  cJSON_malloc = pcVar2;
  cJSON_free = pcVar1;
  return;
}

Assistant:

void cJSON_InitHooks(cJSON_Hooks* hooks)
{
    if (!hooks) { /* Reset hooks */
        cJSON_malloc = malloc;
        cJSON_free = free;
        return;
    }

	cJSON_malloc = (hooks->malloc_fn)?hooks->malloc_fn:malloc;
	cJSON_free	 = (hooks->free_fn)?hooks->free_fn:free;
}